

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate-names.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_17::NameGenerator::VisitModule(NameGenerator *this,Module *module)

{
  bool bVar1;
  Result RVar2;
  reference ppIVar3;
  reference ppEVar4;
  Export *export_;
  iterator __end2_1;
  iterator __begin2_1;
  vector<wabt::Export_*,_std::allocator<wabt::Export_*>_> *__range2_1;
  Import *import;
  iterator __end2;
  iterator __begin2;
  vector<wabt::Import_*,_std::allocator<wabt::Import_*>_> *__range2;
  Module *module_local;
  NameGenerator *this_local;
  
  this->module_ = module;
  __end2 = std::vector<wabt::Import_*,_std::allocator<wabt::Import_*>_>::begin(&module->imports);
  import = (Import *)
           std::vector<wabt::Import_*,_std::allocator<wabt::Import_*>_>::end(&module->imports);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<wabt::Import_**,_std::vector<wabt::Import_*,_std::allocator<wabt::Import_*>_>_>
                                *)&import);
    if (!bVar1) {
      __end2_1 = std::vector<wabt::Export_*,_std::allocator<wabt::Export_*>_>::begin
                           (&module->exports);
      export_ = (Export *)
                std::vector<wabt::Export_*,_std::allocator<wabt::Export_*>_>::end(&module->exports);
      while( true ) {
        bVar1 = __gnu_cxx::operator!=
                          (&__end2_1,
                           (__normal_iterator<wabt::Export_**,_std::vector<wabt::Export_*,_std::allocator<wabt::Export_*>_>_>
                            *)&export_);
        if (!bVar1) {
          VisitAll<wabt::Global>(this,&module->globals,0x16a5ab0);
          VisitAll<wabt::FuncType>(this,&module->func_types,0x16a5c20);
          VisitAll<wabt::Func>(this,&module->funcs,0x16a5d90);
          VisitAll<wabt::Table>(this,&module->tables,0x16a5f50);
          VisitAll<wabt::Memory>(this,&module->memories,0x16a60c0);
          VisitAll<wabt::Exception>(this,&module->excepts,0x16a6230);
          VisitAll<wabt::DataSegment>(this,&module->data_segments,0x16a63a0);
          VisitAll<wabt::ElemSegment>(this,&module->elem_segments,0x16a6510);
          this->module_ = (Module *)0x0;
          Result::Result((Result *)((long)&this_local + 4),Ok);
          return (Result)this_local._4_4_;
        }
        ppEVar4 = __gnu_cxx::
                  __normal_iterator<wabt::Export_**,_std::vector<wabt::Export_*,_std::allocator<wabt::Export_*>_>_>
                  ::operator*(&__end2_1);
        RVar2 = VisitExport(this,*ppEVar4);
        bVar1 = Failed(RVar2);
        if (bVar1) break;
        __gnu_cxx::
        __normal_iterator<wabt::Export_**,_std::vector<wabt::Export_*,_std::allocator<wabt::Export_*>_>_>
        ::operator++(&__end2_1);
      }
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    ppIVar3 = __gnu_cxx::
              __normal_iterator<wabt::Import_**,_std::vector<wabt::Import_*,_std::allocator<wabt::Import_*>_>_>
              ::operator*(&__end2);
    RVar2 = VisitImport(this,*ppIVar3);
    bVar1 = Failed(RVar2);
    if (bVar1) break;
    __gnu_cxx::
    __normal_iterator<wabt::Import_**,_std::vector<wabt::Import_*,_std::allocator<wabt::Import_*>_>_>
    ::operator++(&__end2);
  }
  Result::Result((Result *)((long)&this_local + 4),Error);
  return (Result)this_local._4_4_;
}

Assistant:

Result NameGenerator::VisitModule(Module* module) {
  module_ = module;
  // Visit imports and exports first to give better names, derived from the
  // import/export name.
  for (auto* import : module->imports) {
    CHECK_RESULT(VisitImport(import));
  }
  for (auto* export_ : module->exports) {
    CHECK_RESULT(VisitExport(export_));
  }

  VisitAll(module->globals, &NameGenerator::VisitGlobal);
  VisitAll(module->func_types, &NameGenerator::VisitFuncType);
  VisitAll(module->funcs, &NameGenerator::VisitFunc);
  VisitAll(module->tables, &NameGenerator::VisitTable);
  VisitAll(module->memories, &NameGenerator::VisitMemory);
  VisitAll(module->excepts, &NameGenerator::VisitExcept);
  VisitAll(module->data_segments, &NameGenerator::VisitDataSegment);
  VisitAll(module->elem_segments, &NameGenerator::VisitElemSegment);
  module_ = nullptr;
  return Result::Ok;
}